

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O1

void __thiscall
PMsgIRCCommand::trigger
          (PMsgIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  string_view name;
  char cVar1;
  undefined8 uVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  size_type __n;
  char *in_whitespace_end;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  command_split;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  size_t local_60;
  IRC_Bot *local_58;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_50;
  
  in_whitespace_end = nick._M_str;
  __n = nick._M_len;
  local_60 = parameters._M_len;
  jessilib::
  word_split_once<std::basic_string_view<char,std::char_traits<char>>,char_const*,char_const*,char_const*,char_const*>
            (&local_50,(jessilib *)parameters._M_str,parameters._M_str + parameters._M_len," \t","",
             in_whitespace_end);
  if (local_50.second._M_len == 0) {
    Jupiter::IRC::Client::sendNotice
              (source,__n,in_whitespace_end,0x3a,
               "Error: Too Few Parameters. Syntax: PMsg <Player> <Message>");
  }
  else {
    Jupiter::IRC::Client::getChannel(source,channel._M_len,channel._M_str);
    Jupiter::IRC::Client::Channel::getType();
    name._M_str = local_50.first._M_str;
    name._M_len = local_50.first._M_len;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    local_58 = source;
    uVar2 = Jupiter::IRC::Client::getChannel(source,channel._M_len,channel._M_str);
    cVar1 = Jupiter::IRC::Client::Channel::getUserPrefix(uVar2,__n,in_whitespace_end);
    if (cVar1 != '\0') {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&local_a0,cVar1);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&local_a0,in_whitespace_end,__n);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&local_a0,"@IRC: ");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&local_a0,local_50.second._M_str,local_50.second._M_len);
    if (local_60 != 0) {
      uVar5 = 0;
      while( true ) {
        RenX::getCore();
        uVar3 = RenX::Core::getServerCount();
        if (uVar3 == uVar5) break;
        uVar3 = RenX::getCore();
        uVar2 = RenX::Core::getServer(uVar3);
        cVar1 = RenX::Server::isLogChanType((int)uVar2);
        if (cVar1 != '\0') {
          lVar4 = RenX::Server::getPlayerByPartName
                            (uVar2,local_50.first._M_len,local_50.first._M_str);
          if (lVar4 == 0) {
            player_not_found_message_abi_cxx11_(&local_80,name);
            Jupiter::IRC::Client::sendNotice
                      (local_58,__n,in_whitespace_end,local_80._M_string_length,
                       local_80._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            RenX::Server::sendMessage
                      (uVar2,lVar4,local_a0._M_string_length,local_a0._M_dataplus._M_p);
          }
        }
        uVar5 = uVar5 + 1;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,
                      CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                               local_a0.field_2._M_local_buf[0]) + 1);
    }
  }
  return;
}

Assistant:

void PMsgIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	auto command_split = jessilib::word_split_once_view(std::string_view{parameters}, WHITESPACE_SV);
	if (!command_split.second.empty())
	{
		int type = source->getChannel(channel)->getType();

		std::string_view name = command_split.first;
		RenX::PlayerInfo *player;
		std::string msg;
		char prefix = source->getChannel(channel)->getUserPrefix(nick);
		if (prefix != '\0')
			msg += prefix;
		msg += nick;
		msg += "@IRC: ";
		msg += command_split.second;
		if (!parameters.empty())
		{
			for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++)
			{
				RenX::Server *server = RenX::getCore()->getServer(i);
				if (server->isLogChanType(type))
				{
					player = server->getPlayerByPartName(name);
					if (player != nullptr) {
						server->sendMessage(*player, msg);
					}
					else {
						source->sendNotice(nick, player_not_found_message(name));
					}
				}
			}
		}
	}
	else source->sendNotice(nick, "Error: Too Few Parameters. Syntax: PMsg <Player> <Message>"sv);
}